

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void free_arg_list(JSContext *ctx,JSValue *tab,uint32_t len)

{
  JSValueUnion JVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  JSValue v;
  
  if (len != 0) {
    lVar4 = 0;
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)((long)&tab->u + lVar4))->ptr;
      iVar3 = *(int64_t *)((long)&tab->tag + lVar4);
      if ((0xfffffff4 < (uint)iVar3) &&
         (iVar2 = *JVar1.ptr, *(int *)JVar1.ptr = iVar2 + -1, iVar2 < 2)) {
        v.tag = iVar3;
        v.u.ptr = JVar1.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)len << 4 != lVar4);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,tab);
  return;
}

Assistant:

static void free_arg_list(JSContext *ctx, JSValue *tab, uint32_t len)
{
    uint32_t i;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, tab[i]);
    }
    js_free(ctx, tab);
}